

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O1

void __thiscall
miniros::ServiceClientLink::onRequestLength
          (ServiceClientLink *this,ConnectionPtr *conn,shared_ptr<unsigned_char[]> *buffer,
          uint32_t size,bool success)

{
  uint __fd;
  undefined3 in_register_00000081;
  undefined1 local_38 [16];
  undefined1 local_28 [24];
  
  if (CONCAT31(in_register_00000081,success) != 0) {
    __fd = *(uint *)(buffer->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (__fd < 0x3b9aca01) {
      local_38._8_8_ = 0;
      local_28._8_8_ =
           std::
           _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp:227:7)>
           ::_M_invoke;
      local_28._0_8_ =
           std::
           _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp:227:7)>
           ::_M_manager;
      local_38._0_8_ = this;
      Connection::read((this->connection_).
                       super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       __fd,local_38,0x1fdb2e);
      if ((code *)local_28._0_8_ != (code *)0x0) {
        (*(code *)local_28._0_8_)(local_38,local_38,3);
      }
    }
    else {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (onRequestLength::loc.initialized_ == false) {
        local_38._0_8_ = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_38,"miniros.service_client_link","");
        console::initializeLogLocation(&onRequestLength::loc,(string *)local_38,Error);
        if ((undefined1 *)local_38._0_8_ != local_28) {
          operator_delete((void *)local_38._0_8_,local_28._0_8_ + 1);
        }
      }
      if (onRequestLength::loc.level_ != Error) {
        onRequestLength();
      }
      if (onRequestLength::loc.logger_enabled_ == true) {
        onRequestLength();
      }
      Connection::drop((conn->super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,Destructing);
    }
  }
  return;
}

Assistant:

void ServiceClientLink::onRequestLength(const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
{
  (void)size;
  if (!success)
    return;

  MINIROS_ASSERT(conn == connection_);
  MINIROS_ASSERT(size == 4);

  uint32_t len = *((uint32_t*)buffer.get());

  if (len > 1000000000)
  {
    MINIROS_ERROR("a message of over a gigabyte was " \
                "predicted in tcpros. that seems highly " \
                "unlikely, so I'll assume protocol " \
                "synchronization is lost.");
    conn->drop(Connection::Destructing);
    return;
  }

  connection_->read(len,
      [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
      {
          this->onRequest(conn, buffer, size, success);
      });
}